

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  Data *pDVar2;
  int *piVar3;
  bool bVar4;
  char cVar5;
  QString *data;
  pointer pCVar6;
  storage_type *psVar7;
  ulong uVar8;
  int iVar9;
  storage_type *psVar10;
  long lVar11;
  long in_FS_OFFSET;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QStringView QVar15;
  QArrayData *d;
  QMap<QString,_QList<QString>_> versionCommandMapping;
  VkSpecParser parser;
  QString local_168;
  QArrayDataPointer<QString> local_148;
  QMap<QString,_QList<QString>_> local_130;
  QArrayDataPointer<VkSpecParser::Command> local_128;
  VkSpecParser local_108;
  undefined8 local_b8;
  undefined8 uStack_b0;
  int local_9c;
  QString local_98;
  char16_t *local_80 [2];
  qsizetype local_70 [2];
  char16_t *local_60;
  undefined8 local_58;
  undefined8 local_50;
  char16_t *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8 = 0xaaaaaaaaaaaaaaaa;
  uStack_b0 = 0xaaaaaaaaaaaaaaaa;
  local_9c = argc;
  QCoreApplication::QCoreApplication((QCoreApplication *)&local_b8,&local_9c,argv,0x60a00);
  local_108.m_fn.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_108.m_fn.d.size = -0x5555555555555556;
  local_108.m_versionCommandMapping.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_*>
          )0xaaaaaaaaaaaaaaaa;
  local_108.m_fn.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_108.m_commands.d.ptr = (Command *)0xaaaaaaaaaaaaaaaa;
  local_108.m_commands.d.size = -0x5555555555555556;
  local_108.m_reader = (QXmlStreamReader)0xaa;
  local_108._17_7_ = 0xaaaaaaaaaaaaaa;
  local_108.m_commands.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_108.m_file = (QFile)0xaa;
  local_108._1_7_ = 0xaaaaaaaaaaaaaa;
  local_108._8_8_ = 0xaaaaaaaaaaaaaaaa;
  QFile::QFile(&local_108.m_file);
  QXmlStreamReader::QXmlStreamReader(&local_108.m_reader);
  local_108.m_fn.d.d = (Data *)0x0;
  local_108.m_fn.d.ptr = (char16_t *)0x0;
  local_108.m_commands.d.size = 0;
  local_108.m_versionCommandMapping.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_*>
          )0x0;
  local_108.m_commands.d.d = (Data *)0x0;
  local_108.m_commands.d.ptr = (Command *)0x0;
  local_108.m_fn.d.size = 0;
  if (local_9c < 4) {
    main_cold_1();
    iVar9 = 1;
  }
  else {
    if (argv[1] == (char *)0x0) {
      psVar10 = (storage_type *)0x0;
    }
    else {
      psVar7 = (storage_type *)0xffffffffffffffff;
      do {
        psVar10 = psVar7 + 1;
        pcVar1 = argv[1] + 1 + (long)psVar7;
        psVar7 = psVar10;
      } while (*pcVar1 != '\0');
    }
    QVar12.m_data = psVar10;
    QVar12.m_size = (qsizetype)&local_98;
    QString::fromUtf8(QVar12);
    QString::operator=(&local_108.m_fn,&local_98);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    bVar4 = VkSpecParser::parse(&local_108);
    iVar9 = 1;
    if (bVar4) {
      local_128.d = local_108.m_commands.d.d;
      local_128.ptr = local_108.m_commands.d.ptr;
      local_128.size = local_108.m_commands.d.size;
      if (local_108.m_commands.d.d != (Data *)0x0) {
        LOCK();
        ((local_108.m_commands.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.m_commands.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + 1;
        UNLOCK();
      }
      local_130.d.d.ptr = local_108.m_versionCommandMapping.d.d.ptr;
      if (local_108.m_versionCommandMapping.d.d.ptr !=
          (totally_ordered_wrapper<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_*>
           )0x0) {
        LOCK();
        *(int *)local_108.m_versionCommandMapping.d.d.ptr =
             *(int *)local_108.m_versionCommandMapping.d.d.ptr + 1;
        UNLOCK();
      }
      local_148.size = -0x5555555555555556;
      local_148.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_148.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
      local_98.d.d = (Data *)0x0;
      local_98.d.ptr = L"vkCreateInstance";
      local_98.d.size = 0x10;
      local_80[0] = (char16_t *)0x0;
      local_80[1] = L"vkDestroyInstance";
      local_70[0] = 0x11;
      local_70[1] = 0;
      local_60 = L"vkGetInstanceProcAddr";
      local_58 = 0x15;
      local_50 = 0;
      local_48 = L"vkEnumerateInstanceVersion";
      local_40 = 0x1a;
      local_168.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_148.ptr =
           (QString *)QArrayData::allocate((QArrayData **)&local_168,0x18,0x10,4,KeepSize);
      local_148.d = (Data *)local_168.d.d;
      local_148.size = 0;
      uVar8 = 0xffffffffffffffe8;
      do {
        pDVar2 = *(Data **)((long)local_80 + uVar8);
        local_148.ptr[local_148.size].d.d = pDVar2;
        local_148.ptr[local_148.size].d.ptr = *(char16_t **)((long)local_80 + uVar8 + 8);
        local_148.ptr[local_148.size].d.size = *(qsizetype *)((long)local_70 + uVar8);
        if (pDVar2 != (Data *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        local_148.size = local_148.size + 1;
        uVar8 = uVar8 + 0x18;
      } while (uVar8 < 0x48);
      lVar11 = 0x48;
      do {
        piVar3 = *(int **)((long)&local_98.d.d + lVar11);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            QArrayData::deallocate(*(QArrayData **)((long)&local_98.d.d + lVar11),2,0x10);
          }
        }
        lVar11 = lVar11 + -0x18;
      } while (lVar11 != -0x18);
      if (local_128.size != 0) {
        lVar11 = 0;
        iVar9 = 0;
        do {
          pCVar6 = QList<VkSpecParser::Command>::data((QList<VkSpecParser::Command> *)&local_128);
          QVar15.m_data = pCVar6[lVar11].cmd.name.d.ptr;
          QVar15.m_size = pCVar6[lVar11].cmd.name.d.size;
          cVar5 = QtPrivate::QStringList_contains((QList *)&local_148,QVar15,CaseSensitive);
          if (cVar5 != '\0') {
            if ((local_128.d == (Data *)0x0) ||
               (1 < ((local_128.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i))
            {
              QArrayDataPointer<VkSpecParser::Command>::reallocateAndGrow
                        (&local_128,GrowsAtEnd,0,(QArrayDataPointer<VkSpecParser::Command> *)0x0);
            }
            iVar9 = iVar9 + -1;
            QtPrivate::QGenericArrayOps<VkSpecParser::Command>::erase
                      ((QGenericArrayOps<VkSpecParser::Command> *)&local_128,local_128.ptr + lVar11,
                       1);
          }
          iVar9 = iVar9 + 1;
          lVar11 = (long)iVar9;
        } while (lVar11 < local_128.size);
      }
      local_98.d.size = -0x5555555555555556;
      local_98.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_98.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      if (argv[2] == (char *)0x0) {
        psVar10 = (storage_type *)0x0;
      }
      else {
        psVar7 = (storage_type *)0xffffffffffffffff;
        do {
          psVar10 = psVar7 + 1;
          pcVar1 = argv[2] + 1 + (long)psVar7;
          psVar7 = psVar10;
        } while (*pcVar1 != '\0');
      }
      QVar13.m_data = psVar10;
      QVar13.m_size = (qsizetype)&local_98;
      QString::fromUtf8(QVar13);
      local_168.d.size = -0x5555555555555556;
      local_168.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_168.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      if (argv[3] == (char *)0x0) {
        psVar10 = (storage_type *)0x0;
      }
      else {
        psVar7 = (storage_type *)0xffffffffffffffff;
        do {
          psVar10 = psVar7 + 1;
          pcVar1 = argv[3] + 1 + (long)psVar7;
          psVar7 = psVar10;
        } while (*pcVar1 != '\0');
      }
      QVar14.m_data = psVar10;
      QVar14.m_size = (qsizetype)&local_168;
      QString::fromUtf8(QVar14);
      genVulkanFunctionsH((QList<VkSpecParser::Command> *)&local_128,&local_130,&local_98,&local_168
                         );
      genVulkanFunctionsPH
                ((QList<VkSpecParser::Command> *)&local_128,&local_130,&local_98,&local_168);
      genVulkanFunctionsPC
                ((QList<VkSpecParser::Command> *)&local_128,&local_130,&local_98,&local_168);
      if (&(local_168.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_168.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_168.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_148);
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2(&local_130.d);
      QArrayDataPointer<VkSpecParser::Command>::~QArrayDataPointer(&local_128);
      iVar9 = 0;
    }
  }
  if (&(local_108.m_fn.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.m_fn.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.m_fn.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.m_fn.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.m_fn.d.d)->super_QArrayData,2,0x10);
    }
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_108.m_versionCommandMapping.d);
  QArrayDataPointer<VkSpecParser::Command>::~QArrayDataPointer(&local_108.m_commands.d);
  QXmlStreamReader::~QXmlStreamReader(&local_108.m_reader);
  QFile::~QFile(&local_108.m_file);
  QCoreApplication::~QCoreApplication((QCoreApplication *)&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar9;
}

Assistant:

int main(int argc, char **argv)
{
    QCoreApplication app(argc, argv);
    VkSpecParser parser;

    if (argc < 4) {
        qWarning("Usage: qvkgen input_vk_xml input_license_header output_base\n"
                 "  For example: qvkgen vulkan/vk.xml vulkan/qvulkanfunctions.header vulkan/qvulkanfunctions");
        return 1;
    }

    parser.setFileName(QString::fromUtf8(argv[1]));

    if (!parser.parse())
        return 1;

    // Now we have a list of functions (commands), including extensions, and a
    // table of Version (1.0, 1.1, 1.2) -> Core functions in that version.
    QList<VkSpecParser::Command> commands = parser.commands();
    QMap<QString, QStringList> versionCommandMapping = parser.versionCommandMapping();

    QStringList ignoredFuncs {
        QStringLiteral("vkCreateInstance"),
        QStringLiteral("vkDestroyInstance"),
        QStringLiteral("vkGetInstanceProcAddr"),
        QStringLiteral("vkEnumerateInstanceVersion")
    };
    for (int i = 0; i < commands.size(); ++i) {
        if (ignoredFuncs.contains(commands[i].cmd.name))
            commands.remove(i--);
    }

    QString licenseHeaderFileName = QString::fromUtf8(argv[2]);
    QString outputBase = QString::fromUtf8(argv[3]);
    genVulkanFunctionsH(commands, versionCommandMapping, licenseHeaderFileName, outputBase);
    genVulkanFunctionsPH(commands, versionCommandMapping, licenseHeaderFileName, outputBase);
    genVulkanFunctionsPC(commands, versionCommandMapping, licenseHeaderFileName, outputBase);

    return 0;
}